

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall
quickConvert_invalid_Test::~quickConvert_invalid_Test(quickConvert_invalid_Test *this)

{
  quickConvert_invalid_Test *this_local;
  
  ~quickConvert_invalid_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(quickConvert, invalid)
{
    using namespace units;
    auto u1 = precise::cm;
    auto u2 = precise::lb;
    EXPECT_TRUE(std::isnan(quick_convert(u2, u1)));
    u1 = precise::cm * precise::log::bel;
    u2 = precise::cm * precise::log::bel;
    EXPECT_TRUE(std::isnan(quick_convert(u2, u1)));
}